

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_art_concurrency.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_24d31::
ARTConcurrencyTest_Node4ParallelOps_Test<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
::TestBody(ARTConcurrencyTest_Node4ParallelOps_Test<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
           *this)

{
  tree_verifier<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  *this_00;
  long lVar1;
  key_type key;
  key_type k;
  size_t *psVar2;
  value_view v;
  long alStack_a0 [2];
  array<std::thread,_8UL> threads;
  thread local_50;
  tree_verifier<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  *local_48;
  unsigned_long local_40;
  unsigned_long local_38;
  
  this_00 = &(this->
             super_ARTConcurrencyTest<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
             ).verifier;
  psVar2 = &DAT_001e7a98;
  k = 0;
  do {
    alStack_a0[0] = 0x11d10a;
    v._M_extent._M_extent_value = *psVar2;
    v._M_ptr = (pointer)psVar2[-1];
    unodb::test::
    tree_verifier<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
    ::insert_internal(this_00,k,v,true);
    k = k + 1;
    psVar2 = psVar2 + 2;
  } while (k != 3);
  threads._M_elems[7]._M_id._M_thread =
       (id)ARTConcurrencyTest<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
           ::key_range_op_thread;
  threads._M_elems[3]._M_id._M_thread = (id)0;
  threads._M_elems[4]._M_id._M_thread = (id)0;
  threads._M_elems[5]._M_id._M_thread = (id)0;
  threads._M_elems[6]._M_id._M_thread = (id)0;
  alStack_a0[1] = 0;
  threads._M_elems[0]._M_id._M_thread = (id)0;
  threads._M_elems[1]._M_id._M_thread = (id)0;
  threads._M_elems[2]._M_id._M_thread = (id)0;
  local_38 = 0;
  do {
    local_40 = 6;
    alStack_a0[0] = 0x11d171;
    local_48 = this_00;
    std::thread::
    thread<void(*&)(unodb::test::tree_verifier<unodb::mutex_db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>>*,unsigned_long,unsigned_long),unodb::test::tree_verifier<unodb::mutex_db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>>*,unsigned_long&,unsigned_long,void>
              (&local_50,
               (_func_void_tree_verifier<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_ptr_unsigned_long_unsigned_long
                **)(threads._M_elems + 7),&local_48,&local_38,&local_40);
    if (threads._M_elems[local_38 - 1]._M_id._M_thread != 0) goto LAB_0011d1fa;
    threads._M_elems[local_38 - 1]._M_id._M_thread = (native_handle_type)local_50._M_id._M_thread;
    local_38 = local_38 + 1;
  } while (local_38 < 8);
  lVar1 = 0;
  do {
    alStack_a0[0] = 0x11d1ab;
    std::thread::join();
    lVar1 = lVar1 + 8;
  } while (lVar1 != 0x40);
  lVar1 = 0x40;
  while (*(long *)((long)alStack_a0 + lVar1) == 0) {
    lVar1 = lVar1 + -8;
    if (lVar1 == 0) {
      return;
    }
  }
LAB_0011d1fa:
  alStack_a0[0] = 0x11d1ff;
  std::terminate();
}

Assistant:

UNODB_TYPED_TEST(ARTConcurrencyTest, Node4ParallelOps) {
  this->template key_range_op_test<3, 8, 6>();
}